

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::ReplaceUtf8CharAtIndex
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *dest,String *source,int64_t index)

{
  char *pcVar1;
  size_t sVar2;
  pointer utf8Str;
  pointer pcVar3;
  pointer pcVar4;
  pointer utf8Str_00;
  bool bVar5;
  String out;
  
  utf8Str_00 = (dest->_M_dataplus)._M_p;
  pcVar4 = utf8Str_00 + dest->_M_string_length;
  pcVar1 = GetUtf8CstrByIndex(dest,index);
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    for (; utf8Str_00 < pcVar4; utf8Str_00 = utf8Str_00 + sVar2) {
      if (utf8Str_00 == pcVar1) {
        utf8Str = (source->_M_dataplus)._M_p;
        pcVar3 = utf8Str + source->_M_string_length;
        while (utf8Str < pcVar3) {
          sVar2 = GetUtf8CharSize(utf8Str);
          while (bVar5 = sVar2 != 0, sVar2 = sVar2 - 1, bVar5) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            push_back(&out,*utf8Str);
            utf8Str = utf8Str + 1;
          }
        }
        sVar2 = GetUtf8CharSize(utf8Str_00);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                  (&out,*utf8Str_00);
        sVar2 = 1;
      }
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
              (__return_storage_ptr__,&out);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&out);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> ReplaceUtf8CharAtIndex(const String & dest, const String & source, int64_t index)
	{
		const char * destStart = dest.c_str();
		const char * destEnd = destStart + dest.size();
		const char * destTarget = GetUtf8CstrByIndex(dest, index);
		if (destTarget == nullptr)
			return std::optional<String>();
		String out;
		const char * destCurr = destStart;
		while (destCurr < destEnd)
		{
			if (destCurr == destTarget)
			{
				const char * srcCurr = source.c_str();
				const char * srcEnd = srcCurr + source.size();
				while (srcCurr < srcEnd)
				{
					size_t charCount = GetUtf8CharSize(srcCurr);
					for (size_t i = 0; i < charCount; ++i)
					{
						out += *srcCurr;
						++srcCurr;
					}
				}
				size_t size = GetUtf8CharSize(destCurr);
				destCurr += size;
			}
			else
			{
				out += *destCurr;
				++destCurr;
			}
		}
		return out;
	}